

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O3

uint dic::murmurhash2(void *key)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  int *__s;
  
  __s = *(int **)((long)key + 8);
  sVar2 = strlen((char *)__s);
  uVar4 = (uint)sVar2;
  uVar3 = uVar4 * 0xabcd;
  if (3 < (int)uVar4) {
    do {
      uVar3 = uVar3 * 0x5bd1e995 ^
              ((uint)(*__s * 0x5bd1e995) >> 0x18 ^ *__s * 0x5bd1e995) * 0x5bd1e995;
      __s = __s + 1;
      uVar1 = (uint)sVar2;
      uVar4 = uVar1 - 4;
      sVar2 = (size_t)uVar4;
    } while (7 < uVar1);
  }
  if (uVar4 != 1) {
    if (uVar4 != 2) {
      if (uVar4 != 3) goto LAB_00106adb;
      uVar3 = uVar3 ^ (int)*(char *)((long)__s + 2) << 0x10;
    }
    uVar3 = uVar3 ^ (int)*(char *)((long)__s + 1) << 8;
  }
  uVar3 = ((int)(char)*__s ^ uVar3) * 0x5bd1e995;
LAB_00106adb:
  uVar4 = (uVar3 >> 0xd ^ uVar3) * 0x5bd1e995;
  return uVar4 >> 0xf ^ uVar4;
}

Assistant:

unsigned int dic::murmurhash2(const void *key){

    const unsigned int seed=0xabcd;
    const unsigned int m=0x5bd1e995;
    const int r=24;

    int len=strlen((const char *)((const robj *)key)->ptr);

    unsigned int h=seed*len;

    const char *data=(const char *)((const robj *)key)->ptr;

    while(len>=4){
        unsigned int k=*(unsigned int *)data;

        k*=m;
        k^=k>>r;
        k*=m;

        h*=m;
        h^=k;

        data+=4;
        len-=4;
    }

    switch(len){
        case 3:h^=data[2]<<16;
        case 2:h^=data[1]<<8;
        case 1:h^=data[0];
               h*=m;
    };

    h^=h>>13;
    h*=m;
    h^=h>>15;

    return h;
}